

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void list(string *rootDir)

{
  pointer pIVar1;
  ulong uVar2;
  vector<Image,_std::allocator<Image>_> local_68;
  undefined1 local_50 [8];
  string fileSize;
  
  printf("%4s  %20s  %10s  %30s\n","#","Image ID","Size","Last Modified");
  getContainerImages(&local_68,rootDir);
  if (local_68.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_68.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar2 = 0;
    pIVar1 = local_68.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      getHumanReadableFileSize_abi_cxx11_((string *)local_50,pIVar1->fileSize);
      printf("%4d  %20s  %10s  %30s\n",uVar2,(pIVar1->id)._M_dataplus._M_p,local_50,
             (pIVar1->lastModified)._M_dataplus._M_p);
      if (local_50 != (undefined1  [8])&fileSize._M_string_length) {
        operator_delete((void *)local_50,fileSize._M_string_length + 1);
      }
      pIVar1 = pIVar1 + 1;
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (pIVar1 != local_68.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::vector<Image,_std::allocator<Image>_>::~vector(&local_68);
  return;
}

Assistant:

void list(const std::string& rootDir)
{
    printf("%4s  %20s  %10s  %30s\n", "#", "Image ID", "Size", "Last Modified");
    int count = 0;
    for (const auto& image : getContainerImages(rootDir))
    {
        std::string fileSize = getHumanReadableFileSize(image.fileSize);
        printf("%4d  %20s  %10s  %30s\n", count, image.id.c_str(), fileSize.c_str(), image.lastModified.c_str());
        count++;
    }
}